

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::output_module_def(SystemVerilogCodeGen *this,Generator *generator)

{
  undefined8 uVar1;
  char cVar2;
  uint32_t uVar3;
  ostream *poVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  pointer ppVar6;
  element_type *peVar7;
  char (*extraout_RDX) [12];
  char (*extraout_RDX_00) [12];
  char (*format_str) [12];
  char (*format_str_00) [19];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar8 [16];
  format_args args;
  format_args args_00;
  string_view format_str_01;
  string_view format_str_02;
  _Rb_tree_node_base local_190;
  undefined1 local_170 [24];
  uint64_t i;
  string_view local_148;
  string local_128;
  Generator *local_108;
  Generator *generator_local;
  SystemVerilogCodeGen *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_e8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_d8;
  undefined1 local_c8 [8];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_b8;
  string *local_b0;
  undefined1 local_a8 [16];
  basic_string_view<char> local_98;
  undefined1 local_88 [24];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_68;
  _Rb_tree_node_base *local_60;
  Context *local_58;
  _Base_ptr local_50;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  __node_base local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  _Base_ptr local_30;
  Context *local_28;
  _Base_ptr local_20;
  Context *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_108 = generator;
  generator_local = (Generator *)this;
  auVar8 = std::__cxx11::string::empty();
  format_str = auVar8._8_8_;
  if ((auVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    poVar4 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,"`include \""
                            );
    poVar4 = std::operator<<(poVar4,(string *)&(this->options_).package_name);
    poVar4 = std::operator<<(poVar4,".svh\"");
    cVar2 = Stream::endl(&this->stream_);
    poVar4 = std::operator<<(poVar4,cVar2);
    cVar2 = Stream::endl(&this->stream_);
    std::operator<<(poVar4,cVar2);
    poVar4 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,"import ");
    poVar4 = std::operator<<(poVar4,(string *)&(this->options_).package_name);
    poVar4 = std::operator<<(poVar4,"::*;");
    cVar2 = Stream::endl(&this->stream_);
    std::operator<<(poVar4,cVar2);
    format_str = extraout_RDX;
  }
  if ((local_108->debug & 1U) != 0) {
    uVar3 = Stream::line_no(&this->stream_);
    (local_108->super_IRNode).verilog_ln = uVar3;
    format_str = extraout_RDX_00;
  }
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_108->name;
  local_b8 = "module {0} ";
  local_b0 = &local_128;
  local_d8.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string&,char[12],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"module {0} ",(v7 *)vargs,format_str,
                  (remove_reference_t<std::__cxx11::basic_string<char>_&> *)"module {0} ");
  local_c8 = (undefined1  [8])&local_d8;
  local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
              )fmt::v7::to_string_view<char,_0>(local_b8);
  local_40._M_nxt = (_Hash_node_base *)&this_local;
  local_48 = (anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
              *)local_c8;
  local_38 = (anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
              *)local_c8;
  local_10 = (anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
              *)local_c8;
  local_30 = (_Base_ptr)local_40._M_nxt;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_40._M_nxt,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_c8);
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_f0.values_;
  format_str_01.size_ = (size_t)this_local;
  format_str_01.data_ = (char *)local_e8._8_8_;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_128,(detail *)local_e8._M_allocated_capacity,format_str_01,args);
  std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  generate_module_package_import(this,local_108);
  generate_parameters(this,local_108);
  local_148 = indent(this);
  pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->stream_).super_stringstream.field_0x10,local_148);
  poVar4 = std::operator<<(pbVar5,"(");
  cVar2 = Stream::endl(&this->stream_);
  std::operator<<(poVar4,cVar2);
  generate_ports(this,local_108);
  _i = indent(this);
  pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->stream_).super_stringstream.field_0x10,_i);
  poVar4 = std::operator<<(pbVar5,");");
  cVar2 = Stream::endl(&this->stream_);
  poVar4 = std::operator<<(poVar4,cVar2);
  cVar2 = Stream::endl(&this->stream_);
  std::operator<<(poVar4,cVar2);
  generate_enums(this,local_108);
  generate_variables(this,local_108);
  generate_interface(this,local_108);
  generate_functions(this,local_108);
  local_170._16_8_ = (pointer)0x0;
  while( true ) {
    uVar1 = local_170._16_8_;
    ppVar6 = (pointer)Generator::stmts_count(local_108);
    if (ppVar6 <= (ulong)uVar1) break;
    Generator::get_stmt((Generator *)local_170,(uint32_t)local_108);
    peVar7 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)local_170);
    (**this->_vptr_SystemVerilogCodeGen)(this,peVar7);
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_170);
    local_170._16_8_ =
         &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170._16_8_)->
          field_0x1;
  }
  vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_108->name;
  local_68 = "endmodule   // {0}";
  local_60 = &local_190;
  local_88._0_8_ =
       fmt::v7::make_args_checked<std::__cxx11::string&,char[19],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"endmodule   // {0}",(v7 *)vargs_1,format_str_00,
                  (remove_reference_t<std::__cxx11::basic_string<char>_&> *)"endmodule   // {0}");
  local_88._16_8_ = local_88;
  local_98 = fmt::v7::to_string_view<char,_0>(local_68);
  local_50 = (_Base_ptr)local_a8;
  local_58 = (Context *)local_88._16_8_;
  local_28 = (Context *)local_88._16_8_;
  local_18 = (Context *)local_88._16_8_;
  local_20 = local_50;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_50,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_88._16_8_);
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = local_a8._8_8_;
  format_str_02.size_ = local_a8._0_8_;
  format_str_02.data_ = (char *)local_98.size_;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)&local_190,(detail *)local_98.data_,format_str_02,args_00);
  poVar4 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,
                           (string *)&local_190);
  cVar2 = Stream::endl(&this->stream_);
  std::operator<<(poVar4,cVar2);
  std::__cxx11::string::~string((string *)&local_190);
  return;
}

Assistant:

void SystemVerilogCodeGen::output_module_def(Generator* generator) {  // output module definition
    // insert the header definition, if necessary
    if (!options_.package_name.empty()) {
        // two line indent
        stream_ << "`include \"" << options_.package_name << ".svh\"" << stream_.endl()
                << stream_.endl();
        // import everything
        stream_ << "import " << options_.package_name << "::*;" << stream_.endl();
    }
    if (generator->debug) generator->verilog_ln = stream_.line_no();
    stream_ << ::format("module {0} ", generator->name);
    generate_module_package_import(generator);
    generate_parameters(generator);
    stream_ << indent() << "(" << stream_.endl();
    generate_ports(generator);
    stream_ << indent() << ");" << stream_.endl() << stream_.endl();
    generate_enums(generator);
    generate_variables(generator);
    generate_interface(generator);
    generate_functions(generator);

    for (uint64_t i = 0; i < generator->stmts_count(); i++) {
        dispatch_node(generator->get_stmt(i).get());
    }

    stream_ << ::format("endmodule   // {0}", generator->name) << stream_.endl();
}